

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electromagnetic_Emission_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Electromagnetic_Emission_PDU::SetEmissionSystem
          (Electromagnetic_Emission_PDU *this,
          vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
          *ES)

{
  bool bVar1;
  byte bVar2;
  size_type sVar3;
  pointer this_00;
  __normal_iterator<KDIS::DATA_TYPE::EmissionSystem_*,_std::vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>_>
  local_38;
  __normal_iterator<const_KDIS::DATA_TYPE::EmissionSystem_*,_std::vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>_>
  local_30;
  const_iterator citrEnd;
  __normal_iterator<const_KDIS::DATA_TYPE::EmissionSystem_*,_std::vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>_>
  local_20;
  const_iterator citr;
  vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
  *ES_local;
  Electromagnetic_Emission_PDU *this_local;
  
  citr._M_current = (EmissionSystem *)ES;
  std::vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>::
  operator=(&this->m_vEmissionSystem,ES);
  sVar3 = std::
          vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
          ::size(&this->m_vEmissionSystem);
  this->m_ui8NumberOfEmissionSystems = (KUINT8)sVar3;
  (this->super_Header).super_Header6.m_ui16PDULength = 0x1c;
  citrEnd._M_current =
       (EmissionSystem *)
       std::
       vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>::
       begin(&this->m_vEmissionSystem);
  __gnu_cxx::
  __normal_iterator<KDIS::DATA_TYPE::EmissionSystem_const*,std::vector<KDIS::DATA_TYPE::EmissionSystem,std::allocator<KDIS::DATA_TYPE::EmissionSystem>>>
  ::__normal_iterator<KDIS::DATA_TYPE::EmissionSystem*>
            ((__normal_iterator<KDIS::DATA_TYPE::EmissionSystem_const*,std::vector<KDIS::DATA_TYPE::EmissionSystem,std::allocator<KDIS::DATA_TYPE::EmissionSystem>>>
              *)&local_20,
             (__normal_iterator<KDIS::DATA_TYPE::EmissionSystem_*,_std::vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>_>
              *)&citrEnd);
  local_38._M_current =
       (EmissionSystem *)
       std::
       vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>::
       end(&this->m_vEmissionSystem);
  __gnu_cxx::
  __normal_iterator<KDIS::DATA_TYPE::EmissionSystem_const*,std::vector<KDIS::DATA_TYPE::EmissionSystem,std::allocator<KDIS::DATA_TYPE::EmissionSystem>>>
  ::__normal_iterator<KDIS::DATA_TYPE::EmissionSystem*>
            ((__normal_iterator<KDIS::DATA_TYPE::EmissionSystem_const*,std::vector<KDIS::DATA_TYPE::EmissionSystem,std::allocator<KDIS::DATA_TYPE::EmissionSystem>>>
              *)&local_30,&local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::DATA_TYPE::EmissionSystem_*,_std::vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>_>
              ::operator->(&local_20);
    bVar2 = DATA_TYPE::EmissionSystem::GetSystemDataLength(this_00);
    (this->super_Header).super_Header6.m_ui16PDULength =
         (this->super_Header).super_Header6.m_ui16PDULength + (ushort)bVar2 * 4;
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::EmissionSystem_*,_std::vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void Electromagnetic_Emission_PDU::SetEmissionSystem( const vector<EmissionSystem> & ES )
{
    m_vEmissionSystem = ES;
    m_ui8NumberOfEmissionSystems = m_vEmissionSystem.size();

    // Data length values are in 32 bits so multiply by 4 to get the PDU length
    // which is stored in octets.
    m_ui16PDULength = ELECTROMAGNETIC_EMISSION_PDU_SIZE;

    vector<EmissionSystem>::const_iterator citr = m_vEmissionSystem.begin();
    vector<EmissionSystem>::const_iterator citrEnd = m_vEmissionSystem.end();

    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength += citr->GetSystemDataLength() * 4;
    }
}